

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.c
# Opt level: O0

qpXmlWriter *
qpXmlWriter_createFileWriter(FILE *outputFile,deBool useCompression,deBool flushAfterWrite)

{
  qpXmlWriter *writer;
  deBool flushAfterWrite_local;
  deBool useCompression_local;
  FILE *outputFile_local;
  
  outputFile_local = (FILE *)deCalloc(0x18);
  if (outputFile_local == (FILE *)0x0) {
    outputFile_local = (FILE *)0x0;
  }
  else {
    *(FILE **)outputFile_local = outputFile;
    *(deBool *)&outputFile_local->_IO_read_ptr = flushAfterWrite;
  }
  return (qpXmlWriter *)outputFile_local;
}

Assistant:

qpXmlWriter* qpXmlWriter_createFileWriter (FILE* outputFile, deBool useCompression, deBool flushAfterWrite)
{
	qpXmlWriter* writer = (qpXmlWriter*)deCalloc(sizeof(qpXmlWriter));
	if (!writer)
		return DE_NULL;

	DE_UNREF(useCompression); /* no compression supported. */

	writer->outputFile = outputFile;
	writer->flushAfterWrite = flushAfterWrite;

	return writer;
}